

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

NumberParserImpl * __thiscall
icu_63::DecimalFormat::getCurrencyParser(DecimalFormat *this,UErrorCode *status)

{
  atomic<icu_63::numparse::impl::NumberParserImpl_*> *paVar1;
  NumberParserImpl *pNVar2;
  NumberParserImpl *pNVar3;
  NumberParserImpl *pNVar4;
  NumberParserImpl *pNVar5;
  bool bVar6;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pNVar2 = (this->fields->atomicCurrencyParser)._M_b._M_p;
    pNVar5 = pNVar2;
    if (pNVar2 == (NumberParserImpl *)0x0) {
      pNVar3 = numparse::impl::NumberParserImpl::createParserFromProperties
                         ((this->fields->properties).
                          super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr,
                          (this->fields->symbols).
                          super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr,true,status
                         );
      if (pNVar3 == (NumberParserImpl *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      paVar1 = &this->fields->atomicCurrencyParser;
      LOCK();
      pNVar4 = (paVar1->_M_b)._M_p;
      bVar6 = pNVar4 == (NumberParserImpl *)0x0;
      if (bVar6) {
        (paVar1->_M_b)._M_p = pNVar3;
        pNVar4 = pNVar2;
      }
      UNLOCK();
      pNVar5 = pNVar4;
      if (bVar6) {
        pNVar5 = pNVar3;
      }
      if ((pNVar3 != (NumberParserImpl *)0x0) && (!bVar6)) {
        if (bVar6) {
          pNVar4 = pNVar2;
        }
        (*(pNVar3->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[1])();
        pNVar5 = pNVar4;
      }
    }
    return pNVar5;
  }
  return (NumberParserImpl *)0x0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }